

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O1

void __thiscall Map::showMap(Map *this)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  string local_50;
  
  if (0 < this->gameMap->vertexCount) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,". ",2);
      GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::toString(&local_50,
                 (GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&this->gameMap->vertexList->index + lVar3));
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,local_50._M_dataplus._M_p,local_50._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x48;
    } while (lVar2 < this->gameMap->vertexCount);
  }
  return;
}

Assistant:

void Map::showMap() {
    for (int i = 0; i < gameMap->getVertexCount(); i++)
    {
        cout << (i) << ". " << gameMap->getVertex(i)->toString() << endl;
        // Player can be in all vertices except Manhattan (0) , since it can be in its subvertices
    }
}